

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::uniform_matrixfv_incompatible_type
               (NegativeTestContext *ctx)

{
  ostringstream *this;
  RenderContext *renderCtx;
  GLint location;
  GLint location_00;
  allocator<char> local_2b2;
  allocator<char> local_2b1;
  vector<float,_std::allocator<float>_> data;
  string local_290;
  undefined1 local_270 [384];
  ShaderProgram program;
  
  renderCtx = ctx->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,
             "#version 300 es\nuniform mediump vec4 vec4_v;\nuniform mediump mat4 mat4_v;\nvoid main (void)\n{\n\tgl_Position = mat4_v * vec4_v;\n}\n"
             ,&local_2b1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,
             "#version 300 es\nuniform mediump ivec4 ivec4_f;\nuniform mediump uvec4 uvec4_f;\nuniform sampler2D sampler_f;\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor.xy = (vec4(uvec4_f) + vec4(ivec4_f)).xy;\n\tfragColor.zw = texture(sampler_f, vec2(0.0, 0.0)).zw;\n}\n"
             ,&local_2b2);
  glu::makeVtxFragSources((ProgramSources *)local_270,(string *)&data,&local_290);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,(ProgramSources *)local_270);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&data);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,program.m_program.m_program);
  location = glu::CallLogWrapper::glGetUniformLocation
                       (&ctx->super_CallLogWrapper,program.m_program.m_program,"mat4_v");
  location_00 = glu::CallLogWrapper::glGetUniformLocation
                          (&ctx->super_CallLogWrapper,program.m_program.m_program,"sampler_f");
  NegativeTestContext::expectError(ctx,0);
  if (location == -1 || location_00 == -1) {
    local_270._0_8_ = (ctx->super_CallLogWrapper).m_log;
    this = (ostringstream *)(local_270 + 8);
    std::__cxx11::ostringstream::ostringstream(this);
    std::operator<<((ostream *)this,"// ERROR: Failed to retrieve uniform location");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_270,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_270,"Failed to retrieve uniform location",(allocator<char> *)&data);
    NegativeTestContext::fail(ctx,(string *)local_270);
    std::__cxx11::string::~string((string *)local_270);
  }
  std::vector<float,_std::allocator<float>_>::vector(&data,0x10,(allocator_type *)local_270);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_270,
             "GL_INVALID_OPERATION is generated if the size of the uniform variable declared in the shader does not match the size indicated by the ctx.glUniform command."
             ,(allocator<char> *)&local_290);
  NegativeTestContext::beginSection(ctx,(string *)local_270);
  std::__cxx11::string::~string((string *)local_270);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,program.m_program.m_program);
  glu::CallLogWrapper::glUniformMatrix2fv
            (&ctx->super_CallLogWrapper,location,1,'\0',
             data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniformMatrix3fv
            (&ctx->super_CallLogWrapper,location,1,'\0',
             data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniformMatrix4fv
            (&ctx->super_CallLogWrapper,location,1,'\0',
             data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glUniformMatrix2x3fv
            (&ctx->super_CallLogWrapper,location,1,'\0',
             data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniformMatrix3x2fv
            (&ctx->super_CallLogWrapper,location,1,'\0',
             data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniformMatrix2x4fv
            (&ctx->super_CallLogWrapper,location,1,'\0',
             data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniformMatrix4x2fv
            (&ctx->super_CallLogWrapper,location,1,'\0',
             data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniformMatrix3x4fv
            (&ctx->super_CallLogWrapper,location,1,'\0',
             data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniformMatrix4x3fv
            (&ctx->super_CallLogWrapper,location,1,'\0',
             data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_270,
             "GL_INVALID_OPERATION is generated if a sampler is loaded using a command other than ctx.glUniform1i and ctx.glUniform1iv."
             ,(allocator<char> *)&local_290);
  NegativeTestContext::beginSection(ctx,(string *)local_270);
  std::__cxx11::string::~string((string *)local_270);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,program.m_program.m_program);
  glu::CallLogWrapper::glUniformMatrix2fv
            (&ctx->super_CallLogWrapper,location_00,1,'\0',
             data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniformMatrix3fv
            (&ctx->super_CallLogWrapper,location_00,1,'\0',
             data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniformMatrix4fv
            (&ctx->super_CallLogWrapper,location_00,1,'\0',
             data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniformMatrix2x3fv
            (&ctx->super_CallLogWrapper,location_00,1,'\0',
             data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniformMatrix3x2fv
            (&ctx->super_CallLogWrapper,location_00,1,'\0',
             data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniformMatrix2x4fv
            (&ctx->super_CallLogWrapper,location_00,1,'\0',
             data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniformMatrix4x2fv
            (&ctx->super_CallLogWrapper,location_00,1,'\0',
             data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniformMatrix3x4fv
            (&ctx->super_CallLogWrapper,location_00,1,'\0',
             data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUniformMatrix4x3fv
            (&ctx->super_CallLogWrapper,location_00,1,'\0',
             data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&data.super__Vector_base<float,_std::allocator<float>_>);
  glu::ShaderProgram::~ShaderProgram(&program);
  return;
}

Assistant:

void uniform_matrixfv_incompatible_type (NegativeTestContext& ctx)
{
	glu::ShaderProgram program(ctx.getRenderContext(), glu::makeVtxFragSources(uniformTestVertSource, uniformTestFragSource));

	ctx.glUseProgram			(program.getProgram());
	GLint mat4_v			= ctx.glGetUniformLocation(program.getProgram(), "mat4_v");	// mat4
	GLint sampler_f			= ctx.glGetUniformLocation(program.getProgram(), "sampler_f");	// sampler2D
	ctx.expectError(GL_NO_ERROR);

	if (mat4_v == -1 || sampler_f == -1)
	{
		ctx.getLog() << TestLog::Message << "// ERROR: Failed to retrieve uniform location" << TestLog::EndMessage;
		ctx.fail("Failed to retrieve uniform location");
	}

	std::vector<GLfloat> data(16);

	ctx.beginSection("GL_INVALID_OPERATION is generated if the size of the uniform variable declared in the shader does not match the size indicated by the ctx.glUniform command.");
	ctx.glUseProgram(program.getProgram());
	ctx.glUniformMatrix2fv(mat4_v, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix3fv(mat4_v, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix4fv(mat4_v, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_NO_ERROR);

	ctx.glUniformMatrix2x3fv(mat4_v, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix3x2fv(mat4_v, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix2x4fv(mat4_v, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix4x2fv(mat4_v, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix3x4fv(mat4_v, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix4x3fv(mat4_v, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if a sampler is loaded using a command other than ctx.glUniform1i and ctx.glUniform1iv.");
	ctx.glUseProgram(program.getProgram());
	ctx.glUniformMatrix2fv(sampler_f, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix3fv(sampler_f, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix4fv(sampler_f, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);

	ctx.glUniformMatrix2x3fv(sampler_f, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix3x2fv(sampler_f, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix2x4fv(sampler_f, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix4x2fv(sampler_f, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix3x4fv(sampler_f, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix4x3fv(sampler_f, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glUseProgram(0);
}